

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O1

bool __thiscall ON_LineCurve::IsPlanar(ON_LineCurve *this,ON_Plane *plane,double tolerance)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0);
  if (plane != (ON_Plane *)0x0 && SUB41(iVar2,0) == true) {
    if (this->m_dim == 2) {
      bVar1 = ON_Curve::IsPlanar(&this->super_ON_Curve,plane,tolerance);
      return bVar1;
    }
    bVar1 = ON_Line::InPlane(&this->m_line,plane,tolerance);
    if (!bVar1) {
      ON_Line::InPlane(&this->m_line,plane,0.0);
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool
ON_LineCurve::IsPlanar(
      ON_Plane* plane, // if not nullptr and true is returned, then plane parameters
                         // are filled in
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = IsValid();
  if ( plane != nullptr && rc ) 
  {
    if ( m_dim == 2 )
      rc = ON_Curve::IsPlanar(plane,tolerance);
    else if ( !m_line.InPlane(*plane,tolerance) )
      m_line.InPlane(*plane,0.0);
  }
  return rc;
}